

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_sha1(stb_uchar *output,stb_uchar *buffer,stb_uint len)

{
  uint uVar1;
  stb_uint local_d8 [2];
  stb_uint h [5];
  int local_b8;
  uint local_b4;
  int i;
  stb_uint j;
  stb_uint final_len;
  stb_uint end_start;
  uchar final_block [128];
  stb_uint len_local;
  stb_uchar *buffer_local;
  stb_uchar *output_local;
  
  local_d8[0] = 0x67452301;
  local_d8[1] = 0xefcdab89;
  h[0] = 0x98badcfe;
  h[1] = 0x10325476;
  h[2] = 0xc3d2e1f0;
  j = len & 0xffffffc0;
  if ((len + 9 & 0xffffffc0) == j) {
    j = j - 0x40;
  }
  if (j + 0x80 < len + 9) {
    __assert_fail("end_start + 128 >= len+9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0x18cd,"void stb_sha1(stb_uchar *, stb_uchar *, stb_uint)");
  }
  if ((len <= j) && (0x36 < len)) {
    __assert_fail("end_start < len || len < 64-9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0x18ce,"void stb_sha1(stb_uchar *, stb_uchar *, stb_uint)");
  }
  local_b4 = 0;
  if (len < j) {
    local_b4 = -j;
  }
  for (; j + local_b4 < len; local_b4 = local_b4 + 1) {
    *(stb_uchar *)((long)&final_len + (ulong)local_b4) = buffer[j + local_b4];
  }
  *(undefined1 *)((long)&final_len + (ulong)local_b4) = 0x80;
  uVar1 = local_b4;
  while (local_b4 = uVar1 + 1, local_b4 < 0x7b) {
    *(undefined1 *)((long)&final_len + (ulong)local_b4) = 0;
    uVar1 = local_b4;
  }
  *(byte *)((long)&final_len + (ulong)local_b4) = (byte)(len >> 0x1d);
  *(char *)((long)&final_len + (ulong)(uVar1 + 2)) = (char)(len >> 0x15);
  *(char *)((long)&final_len + (ulong)(uVar1 + 3)) = (char)(len >> 0xd);
  *(char *)((long)&final_len + (ulong)(uVar1 + 4)) = (char)(len >> 5);
  *(char *)((long)&final_len + (ulong)(uVar1 + 5)) = (char)(len << 3);
  if (uVar1 == 0x7a) {
    for (local_b4 = 0; local_b4 < j + 0x80; local_b4 = local_b4 + 0x40) {
      if (local_b4 + 0x40 < j + 0x40) {
        stb__sha1(buffer + local_b4,local_d8);
      }
      else {
        stb__sha1((stb_uchar *)((long)&final_len + (ulong)(local_b4 - j)),local_d8);
      }
    }
    for (local_b8 = 0; local_b8 < 5; local_b8 = local_b8 + 1) {
      output[local_b8 << 2] = (stb_uchar)(local_d8[local_b8] >> 0x18);
      output[local_b8 * 4 + 1] = (stb_uchar)(local_d8[local_b8] >> 0x10);
      output[local_b8 * 4 + 2] = (stb_uchar)(local_d8[local_b8] >> 8);
      output[local_b8 * 4 + 3] = (stb_uchar)local_d8[local_b8];
    }
    return;
  }
  __assert_fail("j == 128 && end_start + j == final_len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                ,0x18df,"void stb_sha1(stb_uchar *, stb_uchar *, stb_uint)");
}

Assistant:

void stb_sha1(stb_uchar output[20], stb_uchar *buffer, stb_uint len)
{
   unsigned char final_block[128];
   stb_uint end_start, final_len, j;
   int i;

   stb_uint h[5];

   h[0] = 0x67452301;
   h[1] = 0xefcdab89;
   h[2] = 0x98badcfe;
   h[3] = 0x10325476;
   h[4] = 0xc3d2e1f0;

   // we need to write padding to the last one or two
   // blocks, so build those first into 'final_block'

   // we have to write one special byte, plus the 8-byte length

   // compute the block where the data runs out
   end_start = len & ~63;

   // compute the earliest we can encode the length
   if (((len+9) & ~63) == end_start) {
      // it all fits in one block, so fill a second-to-last block
      end_start -= 64;
   }

   final_len = end_start + 128;

   // now we need to copy the data in
   assert(end_start + 128 >= len+9);
   assert(end_start < len || len < 64-9);

   j = 0;
   if (end_start > len)
      j = (stb_uint) - (int) end_start;

   for (; end_start + j < len; ++j)
      final_block[j] = buffer[end_start + j];
   final_block[j++] = 0x80;
   while (j < 128-5) // 5 byte length, so write 4 extra padding bytes
      final_block[j++] = 0;
   // big-endian size
   final_block[j++] = len >> 29;
   final_block[j++] = len >> 21;
   final_block[j++] = len >> 13;
   final_block[j++] = len >>  5;
   final_block[j++] = len <<  3;
   assert(j == 128 && end_start + j == final_len);

   for (j=0; j < final_len; j += 64) { // 512-bit chunks
      if (j+64 >= end_start+64)
         stb__sha1(&final_block[j - end_start], h);
      else
         stb__sha1(&buffer[j], h);
   }

   for (i=0; i < 5; ++i) {
      output[i*4 + 0] = h[i] >> 24;
      output[i*4 + 1] = h[i] >> 16;
      output[i*4 + 2] = h[i] >>  8;
      output[i*4 + 3] = h[i] >>  0;
   }
}